

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O2

ON_Line * __thiscall
ON_Plane::IsoLine(ON_Line *__return_storage_ptr__,ON_Plane *this,int dir,double c)

{
  ON_3dPoint local_30;
  
  ON_Line::ON_Line(__return_storage_ptr__);
  if (dir == 0) {
    PointAt(&local_30,this,c,0.0);
    (__return_storage_ptr__->from).z = local_30.z;
    (__return_storage_ptr__->from).x = local_30.x;
    (__return_storage_ptr__->from).y = local_30.y;
    PointAt(&local_30,this,c,1.0);
  }
  else {
    PointAt(&local_30,this,0.0,c);
    (__return_storage_ptr__->from).z = local_30.z;
    (__return_storage_ptr__->from).x = local_30.x;
    (__return_storage_ptr__->from).y = local_30.y;
    PointAt(&local_30,this,1.0,c);
  }
  (__return_storage_ptr__->to).z = local_30.z;
  (__return_storage_ptr__->to).x = local_30.x;
  (__return_storage_ptr__->to).y = local_30.y;
  return __return_storage_ptr__;
}

Assistant:

ON_Line ON_Plane::IsoLine( // iso parametric line
       int dir,              // 0 first parameter varies and second parameter is constant
                         //   e.g., line(t) = plane(t,c)
                         // 1 first parameter is constant and second parameter varies
                         //   e.g., line(t) = plane(c,t)
       double c           // c = value of constant parameter 
       ) const
{
  ON_Line line;
  if ( dir ) {
    line.from = PointAt( 0.0, c );
    line.to   = PointAt( 1.0, c );
  }
  else {
    line.from = PointAt( c, 0.0 );
    line.to   = PointAt( c, 1.0 );
  }
  return line;
}